

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O0

void __thiscall
tcmalloc::CentralFreelist::ReleaseToSpans(CentralFreelist *this,FreeList *freelist,int N)

{
  bool bVar1;
  int iVar2;
  void *ptr_00;
  PageHeap *pPVar3;
  uint64_t id;
  Span *span_00;
  Span *span;
  void *ptr;
  int N_local;
  FreeList *freelist_local;
  CentralFreelist *this_local;
  
  while( true ) {
    bVar1 = FreeList::Empty(freelist);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = CheckState(this);
      if (bVar1) {
        return;
      }
      __assert_fail("CheckState()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                    ,0x89,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
    }
    ptr_00 = FreeList::PopFront(freelist);
    pPVar3 = PageHeap::Instance();
    id = Span::PageIdFromPtr(ptr_00);
    span_00 = PageHeap::GetSpanFromPageId(pPVar3,id);
    if (span_00->location != 0) break;
    if (span_00->size_class != (long)this->class_) {
      __assert_fail("span->size_class == class_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                    ,0x78,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
    }
    bVar1 = FreeList::Empty(&span_00->freelist);
    if (bVar1) {
      RemoveFromList(this,span_00);
      InsertToList(this,&this->nonempty_,span_00);
    }
    span_00->refcount = span_00->refcount - 1;
    this->free_objects_ = this->free_objects_ + 1;
    FreeList::PushFront(&span_00->freelist,ptr_00);
    if (span_00->refcount == 0) {
      iVar2 = FreeList::FreeObjects(&span_00->freelist);
      this->free_objects_ = this->free_objects_ - (long)iVar2;
      RemoveFromList(this,span_00);
      pPVar3 = PageHeap::Instance();
      PageHeap::Delete(pPVar3,span_00);
    }
  }
  __assert_fail("span->location == Span::IN_USE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/central_freelist.hpp"
                ,0x77,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
}

Assistant:

void ReleaseToSpans(FreeList& freelist, int N) {
        while (!freelist.Empty()) {
            void* ptr = freelist.PopFront();
            Span* span = PageHeap::Instance()->GetSpanFromPageId(Span::PageIdFromPtr(ptr));
            assert(span->location == Span::IN_USE);
            assert(span->size_class == class_);

            if (span->freelist.Empty()) {
                RemoveFromList(span);
                InsertToList(&nonempty_, span);
            }

            span->refcount--;
            free_objects_++;
            span->freelist.PushFront(ptr);

            if (span->refcount == 0) {
                free_objects_ -= span->freelist.FreeObjects();
                RemoveFromList(span);
                PageHeap::Instance()->Delete(span);
            }
        }
        assert(CheckState());
    }